

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

int __thiscall QIconModeViewBase::itemIndex(QIconModeViewBase *this,QListViewItem *item)

{
  bool bVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong local_38;
  
  uVar6 = item->indexHint;
  if ((-1 < (int)uVar6 && item->x <= (int)item->w + item->x + -1) &&
      item->y <= (int)item->h + item->y + -1) {
    local_38 = (this->items).d.size;
    if (uVar6 < local_38) {
      bVar1 = QListViewItem::operator==((this->items).d.ptr + uVar6,item);
      if (bVar1) {
        return uVar6;
      }
      local_38 = (ulong)(uint)(this->items).d.size;
    }
    else {
      uVar6 = (int)local_38 - 1;
    }
    bVar2 = true;
    bVar1 = true;
    uVar4 = uVar6;
    do {
      if (bVar1) {
        lVar3 = (long)(int)uVar4;
        bVar1 = QListViewItem::operator==((this->items).d.ptr + lVar3,item);
        uVar5 = uVar4;
        if (bVar1) goto LAB_00574607;
        uVar4 = uVar4 + 1;
        bVar1 = (int)uVar4 < (int)local_38;
      }
      else {
        bVar1 = false;
      }
      if (bVar2) {
        lVar3 = (long)(int)uVar6;
        bVar2 = QListViewItem::operator==((this->items).d.ptr + lVar3,item);
        uVar5 = uVar6;
        if (bVar2) {
LAB_00574607:
          (this->items).d.ptr[lVar3].indexHint = uVar5;
          return uVar5;
        }
        bVar2 = 0 < (int)uVar6;
        uVar6 = uVar6 - 1;
      }
      else {
        bVar2 = false;
      }
    } while (bVar1 || bVar2);
  }
  return -1;
}

Assistant:

int QIconModeViewBase::itemIndex(const QListViewItem &item) const
{
    if (!item.isValid())
        return -1;
    int i = item.indexHint;
    if (i < items.size()) {
        if (items.at(i) == item)
            return i;
    } else {
        i = items.size() - 1;
    }

    int j = i;
    int c = items.size();
    bool a = true;
    bool b = true;

    while (a || b) {
        if (a) {
            if (items.at(i) == item) {
                items.at(i).indexHint = i;
                return i;
            }
            a = ++i < c;
        }
        if (b) {
            if (items.at(j) == item) {
                items.at(j).indexHint = j;
                return j;
            }
            b = --j > -1;
        }
    }
    return -1;
}